

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::section_impl
          (section_impl<ELFIO::Elf32_Shdr> *this,endianness_convertor *convertor,
          address_translator *translator,shared_ptr<ELFIO::compression_interface> *compression)

{
  (this->super_section)._vptr_section = (_func_int **)&PTR__section_impl_0010fc50;
  this->pstream = (istream *)0x0;
  (this->header).sh_name = 0;
  (this->header).sh_type = 0;
  (this->header).sh_flags = 0;
  (this->header).sh_addr = 0;
  (this->header).sh_offset = 0;
  (this->header).sh_size = 0;
  (this->header).sh_link = 0;
  (this->header).sh_info = 0;
  (this->header).sh_addralign = 0;
  (this->header).sh_entsize = 0;
  this->index = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  this->data_size = 0;
  this->convertor = convertor;
  this->translator = translator;
  std::__shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->compression).
              super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>,
             &compression->
              super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>);
  this->is_address_set = false;
  this->stream_size = 0;
  this->is_lazy = false;
  this->is_loaded = false;
  this->can_be_loaded = true;
  return;
}

Assistant:

section_impl( const endianness_convertor*                   convertor,
                  const address_translator*                     translator,
                  const std::shared_ptr<compression_interface>& compression )
        : convertor( convertor ), translator( translator ),
          compression( compression )
    {
    }